

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMovemRgEa<(moira::Instr)77,(moira::Mode)2,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *pSVar2;
  Ea<(moira::Mode)2,_(moira::Size)2> dst;
  Ea<(moira::Mode)2,_(moira::Size)2> local_44;
  
  uVar1 = dasmRead<(moira::Size)2>(this,addr);
  local_44.reg = op & 7;
  local_44.pc = *addr;
  pSVar2 = StrWriter::operator<<(str);
  pSVar2 = StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Align)(this->tab).raw);
  StrWriter::operator<<(pSVar2,(RegRegList)(u16)uVar1);
  StrWriter::operator<<(pSVar2,", ");
  StrWriter::operator<<(pSVar2,&local_44);
  return;
}

Assistant:

void
Moira::dasmMovemRgEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = RegRegList ( dasmRead<Word>(addr)       );
    auto dst = Op <M,S>   ( _____________xxx(op), addr );

    if (M == 4) { src.raw = REVERSE_16(src.raw); }
    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}